

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O1

void Bbr_bddImageTreeDelete_rec(Bbr_ImageNode_t *pNode)

{
  if (pNode->pNode1 != (Bbr_ImageNode_t *)0x0) {
    Bbr_bddImageTreeDelete_rec(pNode->pNode1);
  }
  if (pNode->pNode2 != (Bbr_ImageNode_t *)0x0) {
    Bbr_bddImageTreeDelete_rec(pNode->pNode2);
  }
  if (pNode->bCube != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pNode->dd,pNode->bCube);
  }
  if (pNode->bImage != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pNode->dd,pNode->bImage);
  }
  if (pNode->pPart == (Bbr_ImagePart_t *)0x0) {
    if (pNode != (Bbr_ImageNode_t *)0x0) {
      free(pNode);
      return;
    }
    return;
  }
  __assert_fail("pNode->pPart == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                ,0x285,"void Bbr_bddImageTreeDelete_rec(Bbr_ImageNode_t *)");
}

Assistant:

void Bbr_bddImageTreeDelete_rec( Bbr_ImageNode_t * pNode )
{
    if ( pNode->pNode1 )
        Bbr_bddImageTreeDelete_rec( pNode->pNode1 );
    if ( pNode->pNode2 )
        Bbr_bddImageTreeDelete_rec( pNode->pNode2 );
    if ( pNode->bCube )
        Cudd_RecursiveDeref( pNode->dd, pNode->bCube );
    if ( pNode->bImage )
        Cudd_RecursiveDeref( pNode->dd, pNode->bImage );
    assert( pNode->pPart == NULL );
    ABC_FREE( pNode );
}